

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

int stbir__perform_resize(stbir__info *info,int split_start,int split_count)

{
  stbir__per_split_info *split_info;
  int split_count_local;
  int split_start_local;
  stbir__info *info_local;
  
  if ((info->vertical).is_gather == 0) {
    stbir__vertical_scatter_loop(info,info->split_info + split_start,split_count);
  }
  else {
    stbir__vertical_gather_loop(info,info->split_info + split_start,split_count);
  }
  return 1;
}

Assistant:

static int stbir__perform_resize( stbir__info const * info, int split_start, int split_count )
{
  stbir__per_split_info * split_info = info->split_info + split_start;

  STBIR_PROFILE_CLEAR_EXTRAS();

  STBIR_PROFILE_FIRST_START( looping );
  if (info->vertical.is_gather)
    stbir__vertical_gather_loop( info, split_info, split_count );
  else
    stbir__vertical_scatter_loop( info, split_info, split_count );
  STBIR_PROFILE_END( looping );

  return 1;
}